

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_SINCOS(Context *ctx)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t in_RCX;
  size_t in_RDX;
  char *fmt;
  bool bVar4;
  char src0 [64];
  char dst [64];
  char scratch [64];
  char acStack_f8 [64];
  char local_b8 [64];
  char local_78 [72];
  
  uVar1 = (ctx->dest_arg).writemask;
  if ((ctx->shader_type == MOJOSHADER_TYPE_PIXEL) || (ctx->profile_supports_nv4 != 0)) {
    make_ARB1_destarg_string(ctx,local_b8,in_RDX);
    make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args,acStack_f8,in_RCX);
    if (2 < uVar1 - 1) goto LAB_00112901;
    fmt = &DAT_001203bc + *(int *)(&DAT_001203bc + (ulong)(uVar1 - 1) * 4);
  }
  else {
    if (ctx->profile_supports_nv2 == 0) {
      get_ARB1_destarg_varname(ctx,local_b8,in_RDX);
      get_ARB1_srcarg_varname(ctx,0,acStack_f8,in_RCX);
      if (uVar1 == 2) {
        bVar4 = true;
LAB_001129a4:
        iVar2 = ctx->scratch_registers;
        iVar3 = iVar2 + 1;
        ctx->scratch_registers = iVar3;
        if (ctx->max_scratch_registers <= iVar2) {
          ctx->max_scratch_registers = iVar3;
        }
        snprintf(local_78,0x40,"scratch%d");
        if ((uVar1 & 0xfffffffd) == 1) {
          output_line(ctx,"ABS %s.x, %s.x;",local_b8,acStack_f8);
          output_line(ctx,"MUL %s.x, %s.x, -0.40528473456935108577551785283891;",local_b8,local_b8);
          output_line(ctx,"MUL %s.x, %s.x, 1.2732395447351626861510701069801;",local_78,acStack_f8);
          output_line(ctx,"MAD %s.x, %s.x, %s.x, %s.x;",local_b8,local_b8,acStack_f8,local_78);
        }
        if (!bVar4) goto LAB_00112901;
      }
      else {
        bVar4 = uVar1 == 3;
        if ((uVar1 & 0xfffffffd) == 1) goto LAB_001129a4;
        if (uVar1 != 3) goto LAB_00112901;
      }
      output_line(ctx,"ADD %s.x, %s.x, 1.57079637050628662109375;",local_78,acStack_f8);
      output_line(ctx,"SGE %s.y, %s.x, 3.1415927410125732421875;",local_78,local_78);
      output_line(ctx,"MAD %s.x, %s.y, -6.283185482025146484375, %s.x;",local_78,local_78,local_78);
      output_line(ctx,"ABS %s.x, %s.x;",local_b8,acStack_f8);
      output_line(ctx,"MUL %s.x, %s.x, -0.40528473456935108577551785283891;",local_b8,local_b8);
      output_line(ctx,"MUL %s.x, %s.x, 1.2732395447351626861510701069801;",local_78,acStack_f8);
      output_line(ctx,"MAD %s.y, %s.x, %s.x, %s.x;",local_b8,local_b8,acStack_f8,local_78);
      goto LAB_00112901;
    }
    get_ARB1_destarg_varname(ctx,local_b8,in_RDX);
    make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args,acStack_f8,in_RCX);
    if (uVar1 == 1) {
      fmt = "COS %s.x, %s;";
    }
    else if (uVar1 == 3) {
      output_line(ctx,"SIN %s.x, %s;",local_b8,acStack_f8);
      fmt = "COS %s.y, %s;";
    }
    else {
      if (uVar1 != 2) goto LAB_00112901;
      fmt = "SIN %s.y, %s;";
    }
  }
  output_line(ctx,fmt,local_b8,acStack_f8);
LAB_00112901:
  if (ctx->isfail == 0) {
    emit_ARB1_dest_modifiers(ctx);
  }
  return;
}

Assistant:

static void emit_ARB1_SINCOS(Context *ctx)
{
    // we don't care about the temp registers that <= sm2 demands; ignore them.
    const int mask = ctx->dest_arg.writemask;

    // arb1 fragment programs and everything nv4 have sin/cos/sincos opcodes.
    if ((shader_is_pixel(ctx)) || (support_nv4(ctx)))
    {
        char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
        char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
        if (writemask_x(mask))
            output_line(ctx, "COS%s, %s;", dst, src0);
        else if (writemask_y(mask))
            output_line(ctx, "SIN%s, %s;", dst, src0);
        else if (writemask_xy(mask))
            output_line(ctx, "SCS%s, %s;", dst, src0);
    } // if

    // nv2+ profiles have sin and cos opcodes.
    else if (support_nv2(ctx))
    {
        char dst[64]; get_ARB1_destarg_varname(ctx, dst, sizeof (dst));
        char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
        if (writemask_x(mask))
            output_line(ctx, "COS %s.x, %s;", dst, src0);
        else if (writemask_y(mask))
            output_line(ctx, "SIN %s.y, %s;", dst, src0);
        else if (writemask_xy(mask))
        {
            output_line(ctx, "SIN %s.x, %s;", dst, src0);
            output_line(ctx, "COS %s.y, %s;", dst, src0);
        } // else if
    } // if

    else  // big nasty.
    {
        char dst[64]; get_ARB1_destarg_varname(ctx, dst, sizeof (dst));
        char src0[64]; get_ARB1_srcarg_varname(ctx, 0, src0, sizeof (src0));
        const int need_sin = (writemask_x(mask) || writemask_xy(mask));
        const int need_cos = (writemask_y(mask) || writemask_xy(mask));
        char scratch[64];

        if (need_sin || need_cos)
            allocate_ARB1_scratch_reg_name(ctx, scratch, sizeof (scratch));

        // These sin() and cos() approximations originally found here:
        //    http://www.devmaster.net/forums/showthread.php?t=5784
        //
        // const float B = 4.0f / M_PI;
        // const float C = -4.0f / (M_PI * M_PI);
        // float y = B * x + C * x * fabs(x);
        //
        // // optional better precision...
        // const float P = 0.225f;
        // y = P * (y * fabs(y) - y) + y;
        //
        //
        // That first thing can be reduced to:
        // const float y = ((1.2732395447351626861510701069801f * x) +
        //             ((-0.40528473456935108577551785283891f * x) * fabs(x)));

        if (need_sin)
        {
            // !!! FIXME: use SRCMOD_ABS here?
            output_line(ctx, "ABS %s.x, %s.x;", dst, src0);
            output_line(ctx, "MUL %s.x, %s.x, -0.40528473456935108577551785283891;", dst, dst);
            output_line(ctx, "MUL %s.x, %s.x, 1.2732395447351626861510701069801;", scratch, src0);
            output_line(ctx, "MAD %s.x, %s.x, %s.x, %s.x;", dst, dst, src0, scratch);
        } // if

        // cosine is sin(x + M_PI/2), but you have to wrap x to pi:
        //  if (x+(M_PI/2) > M_PI)
        //      x -= 2 * M_PI;
        //
        // which is...
        //  if (x+(1.57079637050628662109375) > 3.1415927410125732421875)
        //      x += -6.283185482025146484375;

        if (need_cos)
        {
            output_line(ctx, "ADD %s.x, %s.x, 1.57079637050628662109375;", scratch, src0);
            output_line(ctx, "SGE %s.y, %s.x, 3.1415927410125732421875;", scratch, scratch);
            output_line(ctx, "MAD %s.x, %s.y, -6.283185482025146484375, %s.x;", scratch, scratch, scratch);
            output_line(ctx, "ABS %s.x, %s.x;", dst, src0);
            output_line(ctx, "MUL %s.x, %s.x, -0.40528473456935108577551785283891;", dst, dst);
            output_line(ctx, "MUL %s.x, %s.x, 1.2732395447351626861510701069801;", scratch, src0);
            output_line(ctx, "MAD %s.y, %s.x, %s.x, %s.x;", dst, dst, src0, scratch);
        } // if
    } // else

    // !!! FIXME: might not have done anything. Don't emit if we didn't.
    if (!isfail(ctx))
        emit_ARB1_dest_modifiers(ctx);
}